

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O2

void __thiscall icu_63::RegexCompile::insertOp(RegexCompile *this,int32_t where)

{
  uint uVar1;
  int iVar2;
  UVector64 *this_00;
  int32_t iVar3;
  uint type;
  int64_t elem;
  long lVar4;
  
  lVar4 = 0;
  this_00 = this->fRXPat->fCompiledPat;
  elem = 0x7000000;
  if (U_ZERO_ERROR < *this->fStatus) {
    elem = lVar4;
  }
  UVector64::insertElementAt(this_00,elem,where,this->fStatus);
  for (; lVar4 < this_00->count; lVar4 = lVar4 + 1) {
    uVar1 = *(uint *)(this_00->elements + lVar4);
    type = uVar1 >> 0x18;
    if ((((uVar1 & 0xfe000000) == 0x1c000000) ||
        ((type < 0x25 && ((0x108004a040U >> ((ulong)type & 0x3f) & 1) != 0)))) &&
       (where < (int)(uVar1 & 0xffffff))) {
      iVar3 = buildOp(this,type,(uVar1 & 0xffffff) + 1);
      UVector64::setElementAt(this_00,(long)iVar3,(int32_t)lVar4);
    }
  }
  for (lVar4 = 0; lVar4 < (this->fParenStack).count; lVar4 = lVar4 + 1) {
    iVar2 = (this->fParenStack).elements[lVar4];
    if (where < iVar2) {
      UVector32::setElementAt(&this->fParenStack,iVar2 + 1,(int32_t)lVar4);
    }
  }
  if (where < this->fMatchCloseParen) {
    this->fMatchCloseParen = this->fMatchCloseParen + 1;
  }
  if (where < this->fMatchOpenParen) {
    this->fMatchOpenParen = this->fMatchOpenParen + 1;
  }
  return;
}

Assistant:

void   RegexCompile::insertOp(int32_t where) {
    UVector64 *code = fRXPat->fCompiledPat;
    U_ASSERT(where>0 && where < code->size());

    int32_t  nop = buildOp(URX_NOP, 0);
    code->insertElementAt(nop, where, *fStatus);

    // Walk through the pattern, looking for any ops with targets that
    //  were moved down by the insert.  Fix them.
    int32_t loc;
    for (loc=0; loc<code->size(); loc++) {
        int32_t op = (int32_t)code->elementAti(loc);
        int32_t opType = URX_TYPE(op);
        int32_t opValue = URX_VAL(op);
        if ((opType == URX_JMP         ||
            opType == URX_JMPX         ||
            opType == URX_STATE_SAVE   ||
            opType == URX_CTR_LOOP     ||
            opType == URX_CTR_LOOP_NG  ||
            opType == URX_JMP_SAV      ||
            opType == URX_JMP_SAV_X    ||
            opType == URX_RELOC_OPRND)    && opValue > where) {
            // Target location for this opcode is after the insertion point and
            //   needs to be incremented to adjust for the insertion.
            opValue++;
            op = buildOp(opType, opValue);
            code->setElementAt(op, loc);
        }
    }

    // Now fix up the parentheses stack.  All positive values in it are locations in
    //  the compiled pattern.   (Negative values are frame boundaries, and don't need fixing.)
    for (loc=0; loc<fParenStack.size(); loc++) {
        int32_t x = fParenStack.elementAti(loc);
        U_ASSERT(x < code->size());
        if (x>where) {
            x++;
            fParenStack.setElementAt(x, loc);
        }
    }

    if (fMatchCloseParen > where) {
        fMatchCloseParen++;
    }
    if (fMatchOpenParen > where) {
        fMatchOpenParen++;
    }
}